

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appendable.cpp
# Opt level: O0

UBool __thiscall icu_63::Appendable::appendString(Appendable *this,UChar *s,int32_t length)

{
  int iVar1;
  UChar *pUVar2;
  UChar *limit;
  UChar c;
  UChar *pUStack_20;
  int32_t length_local;
  UChar *s_local;
  Appendable *this_local;
  
  pUStack_20 = s;
  if (length < 0) {
    do {
      if (*pUStack_20 == L'\0') goto LAB_003218a1;
      iVar1 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)(ushort)*pUStack_20);
      pUStack_20 = pUStack_20 + 1;
    } while ((char)iVar1 != '\0');
    this_local._7_1_ = '\0';
  }
  else {
    if (0 < length) {
      pUStack_20 = s;
      do {
        pUVar2 = pUStack_20 + 1;
        iVar1 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)(ushort)*pUStack_20);
        if ((char)iVar1 == '\0') {
          return '\0';
        }
        pUStack_20 = pUVar2;
      } while (pUVar2 < s + length);
    }
LAB_003218a1:
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool
Appendable::appendString(const UChar *s, int32_t length) {
    if(length<0) {
        UChar c;
        while((c=*s++)!=0) {
            if(!appendCodeUnit(c)) {
                return FALSE;
            }
        }
    } else if(length>0) {
        const UChar *limit=s+length;
        do {
            if(!appendCodeUnit(*s++)) {
                return FALSE;
            }
        } while(s<limit);
    }
    return TRUE;
}